

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_TestTwoBoundaryFiles::_Run(_Test_TestTwoBoundaryFiles *this)

{
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *this_00;
  FileMetaData *pFVar1;
  FileMetaData *f2;
  FileMetaData *f1;
  FileMetaData *f3;
  Slice local_2a0;
  int local_28c;
  InternalKey local_288;
  InternalKey local_268;
  InternalKey local_248;
  InternalKey local_228;
  InternalKey local_208;
  InternalKey local_1e8;
  Tester local_1c8;
  
  local_1c8._0_8_ = "100";
  local_1c8.fname_ = (char *)0x3;
  InternalKey::InternalKey(&local_1e8,(Slice *)&local_1c8,6,kTypeValue);
  local_2a0.data_ = "100";
  local_2a0.size_ = 3;
  InternalKey::InternalKey(&local_208,&local_2a0,5,kTypeValue);
  pFVar1 = AddBoundaryInputsTest::CreateFileMetaData
                     (&this->super_AddBoundaryInputsTest,1,&local_1e8,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e8);
  local_1c8._0_8_ = "100";
  local_1c8.fname_ = (char *)0x3;
  f1 = pFVar1;
  InternalKey::InternalKey(&local_228,(Slice *)&local_1c8,2,kTypeValue);
  local_2a0.data_ = "300";
  local_2a0.size_ = 3;
  InternalKey::InternalKey(&local_248,&local_2a0,1,kTypeValue);
  pFVar1 = AddBoundaryInputsTest::CreateFileMetaData
                     (&this->super_AddBoundaryInputsTest,1,&local_228,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_228);
  local_1c8._0_8_ = "100";
  local_1c8.fname_ = (char *)0x3;
  f2 = pFVar1;
  InternalKey::InternalKey(&local_268,(Slice *)&local_1c8,4,kTypeValue);
  local_2a0.data_ = "100";
  local_2a0.size_ = 3;
  InternalKey::InternalKey(&local_288,&local_2a0,3,kTypeValue);
  pFVar1 = AddBoundaryInputsTest::CreateFileMetaData
                     (&this->super_AddBoundaryInputsTest,1,&local_268,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_268);
  f3 = pFVar1;
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
            ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)this,&f2);
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
            ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)this,&f3);
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
            ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)this,&f1);
  this_00 = &(this->super_AddBoundaryInputsTest).compaction_files_;
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
            (this_00,&f1);
  AddBoundaryInputs(&(this->super_AddBoundaryInputsTest).icmp_,
                    (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                    this,this_00);
  test::Tester::Tester
            (&local_1c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
             ,0x129);
  local_28c = 3;
  local_2a0.data_ =
       (char *)((long)(this->super_AddBoundaryInputsTest).compaction_files_.
                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->super_AddBoundaryInputsTest).compaction_files_.
                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3);
  test::Tester::IsEq<int,unsigned_long>(&local_1c8,&local_28c,(unsigned_long *)&local_2a0);
  test::Tester::~Tester(&local_1c8);
  test::Tester::Tester
            (&local_1c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
             ,0x12a);
  test::Tester::IsEq<leveldb::FileMetaData*,leveldb::FileMetaData*>
            (&local_1c8,&f1,
             (this_00->
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
             _M_impl.super__Vector_impl_data._M_start);
  test::Tester::~Tester(&local_1c8);
  test::Tester::Tester
            (&local_1c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
             ,299);
  test::Tester::IsEq<leveldb::FileMetaData*,leveldb::FileMetaData*>
            (&local_1c8,&f3,
             (this_00->
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
             _M_impl.super__Vector_impl_data._M_start + 1);
  test::Tester::~Tester(&local_1c8);
  test::Tester::Tester
            (&local_1c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
             ,300);
  test::Tester::IsEq<leveldb::FileMetaData*,leveldb::FileMetaData*>
            (&local_1c8,&f2,
             (this_00->
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
             _M_impl.super__Vector_impl_data._M_start + 2);
  test::Tester::~Tester(&local_1c8);
  return;
}

Assistant:

TEST(AddBoundaryInputsTest, TestTwoBoundaryFiles) {
  FileMetaData* f1 =
      CreateFileMetaData(1, InternalKey("100", 6, kTypeValue),
                         InternalKey(InternalKey("100", 5, kTypeValue)));
  FileMetaData* f2 =
      CreateFileMetaData(1, InternalKey("100", 2, kTypeValue),
                         InternalKey(InternalKey("300", 1, kTypeValue)));
  FileMetaData* f3 =
      CreateFileMetaData(1, InternalKey("100", 4, kTypeValue),
                         InternalKey(InternalKey("100", 3, kTypeValue)));

  level_files_.push_back(f2);
  level_files_.push_back(f3);
  level_files_.push_back(f1);
  compaction_files_.push_back(f1);

  AddBoundaryInputs(icmp_, level_files_, &compaction_files_);
  ASSERT_EQ(3, compaction_files_.size());
  ASSERT_EQ(f1, compaction_files_[0]);
  ASSERT_EQ(f3, compaction_files_[1]);
  ASSERT_EQ(f2, compaction_files_[2]);
}